

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O2

void __thiscall UEFITool::openImageFile(UEFITool *this)

{
  QArrayDataPointer<char16_t> local_70;
  QString path;
  QArrayDataPointer<char16_t> local_40;
  QArrayDataPointer<char16_t> local_28;
  
  tr((QString *)&local_28,"Open BIOS image file",(char *)0x0,-1);
  tr((QString *)&local_40,
     "BIOS image files (*.rom *.bin *.cap *scap *.bio *.fd *.wph *.dec);;All files (*)",(char *)0x0,
     -1);
  QFileDialog::getOpenFileName(&path,this,&local_28,&this->currentDir,&local_40,0,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  local_70.d = path.d.d;
  local_70.ptr = path.d.ptr;
  local_70.size = path.d.size;
  if (path.d.d != (Data *)0x0) {
    LOCK();
    ((path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  openImageFile(this,(QString *)&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&path.d);
  return;
}

Assistant:

void UEFITool::openImageFile()
{
    QString path = QFileDialog::getOpenFileName(this, tr("Open BIOS image file"), currentDir, tr("BIOS image files (*.rom *.bin *.cap *scap *.bio *.fd *.wph *.dec);;All files (*)"));
    openImageFile(path);
}